

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# skiplist.hpp
# Opt level: O2

void __thiscall
skiplist<int,_std::less<int>_>::destroy_all_levels(skiplist<int,_std::less<int>_> *this)

{
  pointer ppSVar1;
  SLNode<int> *pSVar2;
  vector<SLNode<int>_*,_std::allocator<SLNode<int>_*>_> *__range2;
  SLNode<int> *pSVar3;
  pointer ppSVar4;
  
  ppSVar1 = (this->key).super__Vector_base<SLNode<int>_*,_std::allocator<SLNode<int>_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  for (ppSVar4 = (this->key).super__Vector_base<SLNode<int>_*,_std::allocator<SLNode<int>_*>_>.
                 _M_impl.super__Vector_impl_data._M_start; ppSVar4 != ppSVar1; ppSVar4 = ppSVar4 + 1
      ) {
    pSVar3 = *ppSVar4;
    while (pSVar3 != (SLNode<int> *)0x0) {
      pSVar2 = pSVar3->next;
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                (&(pSVar3->valz).super__Vector_base<int,_std::allocator<int>_>);
      operator_delete(pSVar3);
      pSVar3 = pSVar2;
    }
  }
  ppSVar4 = (this->key).super__Vector_base<SLNode<int>_*,_std::allocator<SLNode<int>_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if ((this->key).super__Vector_base<SLNode<int>_*,_std::allocator<SLNode<int>_*>_>._M_impl.
      super__Vector_impl_data._M_finish != ppSVar4) {
    (this->key).super__Vector_base<SLNode<int>_*,_std::allocator<SLNode<int>_*>_>._M_impl.
    super__Vector_impl_data._M_finish = ppSVar4;
  }
  return;
}

Assistant:

void destroy_all_levels() {
        SLNode<val_type> *tmp;
        for(auto level: key)
            while(level) {
                tmp = level->next;
                delete level;
                level = tmp;
            }
        key.clear();
    }